

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O2

int __thiscall Fl_Counter_Type::textstuff(Fl_Counter_Type *this,int w,Fl_Font *f,int *s,Fl_Color *c)

{
  Fl_Type *pFVar1;
  
  if (w == 4) {
    this = (Fl_Counter_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.factory;
  }
  if ((uint)w < 5) {
    pFVar1 = ((Fl_Type *)((long)this + 0x78))->prev;
    switch(w) {
    default:
      *f = *(int *)((long)&pFVar1[1].user_data_type_ + 4);
      *s = *(int *)&((Fl_Label *)&pFVar1[1].comment_)->value;
      *c = *(Fl_Color *)((long)&((Fl_Label *)&pFVar1[1].comment_)->value + 4);
      break;
    case 1:
      *(Fl_Font *)((long)&pFVar1[1].user_data_type_ + 4) = *f;
      break;
    case 2:
      *(int *)&((Fl_Label *)&pFVar1[1].comment_)->value = *s;
      break;
    case 3:
      *(Fl_Color *)((long)&((Fl_Label *)&pFVar1[1].comment_)->value + 4) = *c;
    }
  }
  return 1;
}

Assistant:

int Fl_Counter_Type::textstuff(int w, Fl_Font& f, int& s, Fl_Color& c) {
  Fl_Counter *myo = (Fl_Counter*)(w==4 ? ((Fl_Widget_Type*)factory)->o : o);
  switch (w) {
    case 4:
    case 0: f = myo->textfont(); s = myo->textsize(); c = myo->textcolor(); break;
    case 1: myo->textfont(f); break;
    case 2: myo->textsize(s); break;
    case 3: myo->textcolor(c); break;
  }
  return 1;
}